

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

DUMBFILE * dumbfile_limit_xm(DUMBFILE *f)

{
  DUMBFILE_SYSTEM *dfs;
  DUMBFILE *pDVar1;
  _func_void_void_ptr *in_RDI;
  LIMITED_XM *lx;
  
  dfs = (DUMBFILE_SYSTEM *)malloc(0x28);
  dfs->close = in_RDI;
  dfs->open = (_func_void_ptr_char_ptr *)0x0;
  dfs->skip = (_func_int_void_ptr_long *)0x0;
  dfs->getc = (_func_int_void_ptr *)0x0;
  dfs->getnc = (_func_int32_char_ptr_int32_void_ptr *)0x0;
  pDVar1 = dumbfile_open_ex(in_RDI,dfs);
  return pDVar1;
}

Assistant:

static DUMBFILE *dumbfile_limit_xm(DUMBFILE *f)
{
	LIMITED_XM * lx = malloc(sizeof(*lx));
	lx->remaining = f;
	lx->buffered = NULL;
	lx->ptr = 0;
	lx->limit = 0;
	lx->allocated = 0;
	return dumbfile_open_ex( lx, &limit_xm_dfs );
}